

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_WolfAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DAngle pufftype_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  VMValue *pVVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  PClassActor *type;
  bool bVar7;
  double dVar8;
  int local_1ec;
  int local_1e4;
  bool local_19d;
  int local_19c;
  double local_188;
  bool local_169;
  bool local_157;
  FSoundID local_154;
  TAngle<double> local_150;
  TAngle<double> local_148;
  FName local_13c;
  int local_138;
  TFlags<ActorFlag3,_unsigned_int> local_134;
  int newdam;
  TAngle<double> local_128;
  TFlags<ActorFlag3,_unsigned_int> local_120;
  TFlags<ActorFlag2,_unsigned_int> local_11c;
  AActor *local_118;
  AActor *dpuff;
  TFlags<ActorFlag,_unsigned_int> local_108;
  byte local_101;
  FName local_100;
  int iStack_fc;
  bool spawnblood;
  FName mod;
  int damage;
  undefined1 local_f0 [8];
  DVector3 BloodPos;
  DAngle angle_1;
  int hitchance;
  double speed;
  int idist;
  double dist;
  double dy;
  double dx;
  DVector2 vec;
  undefined1 local_88 [7];
  bool dodge;
  TAngle<double> local_80;
  DAngle angle;
  MetaClass *pufftype;
  double runspeed;
  int longrange;
  int pointblank;
  int blocksize;
  int maxdamage;
  double snipe;
  FSoundID local_48;
  uint local_44;
  FSoundID sound;
  int flags;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x14be,
                  "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar7 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar7 = true, (param->field_0).field_1.atag != 1)) {
    bVar7 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar7) {
    _sound = (AActor *)(param->field_0).field_1.a;
    local_157 = true;
    if (_sound != (AActor *)0x0) {
      local_157 = DObject::IsKindOf((DObject *)_sound,AActor::RegistrationInfo.MyClass);
    }
    if (local_157 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14be,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 2) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14bf,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      local_44 = (pVVar4->field_0).i;
    }
    else {
      if (param[1].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14bf,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      local_44 = param[1].field_0.i;
    }
    FSoundID::FSoundID(&local_48);
    if (numparam < 3) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c0,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      FSoundID::FSoundID((FSoundID *)&snipe,(pVVar4->field_0).i);
      FSoundID::operator=(&local_48,(FSoundID *)&snipe);
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c0,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FSoundID::FSoundID((FSoundID *)((long)&snipe + 4),param[2].field_0.i);
      FSoundID::operator=(&local_48,(FSoundID *)((long)&snipe + 4));
    }
    if (numparam < 4) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c1,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      _blocksize = (DThinker *)(pVVar4->field_0).f;
    }
    else {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c1,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      _blocksize = (DThinker *)param[3].field_0.f;
    }
    if (numparam < 5) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c2,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      pointblank = (pVVar4->field_0).i;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c2,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pointblank = param[4].field_0.i;
    }
    if (numparam < 6) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c3,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      longrange = (pVVar4->field_0).i;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c3,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      longrange = param[5].field_0.i;
    }
    if (numparam < 7) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c4,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      runspeed._4_4_ = (pVVar4->field_0).i;
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c4,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      runspeed._4_4_ = param[6].field_0.i;
    }
    if (numparam < 8) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c5,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      runspeed._0_4_ = (pVVar4->field_0).i;
    }
    else {
      if (param[7].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c5,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      runspeed._0_4_ = param[7].field_0.i;
    }
    if (numparam < 9) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c6,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      pufftype = (MetaClass *)(pVVar4->field_0).field_1.a;
    }
    else {
      if (param[8].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c6,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pufftype = (MetaClass *)param[8].field_0.field_1.a;
    }
    if (numparam < 10) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      bVar7 = false;
      if ((pVVar4->field_0).field_3.Type == '\x03') {
        pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
        bVar7 = true;
        if ((pVVar4->field_0).field_1.atag != 1) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
          bVar7 = (pVVar4->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar7) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c7,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      angle.Degrees = (double)(pVVar4->field_0).field_1.a;
    }
    else {
      bVar7 = false;
      if ((param[9].field_0.field_3.Type == '\x03') &&
         (bVar7 = true, param[9].field_0.field_1.atag != 1)) {
        bVar7 = param[9].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar7) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x14c7,
                      "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      angle.Degrees = (double)param[9].field_0.field_1.a;
    }
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
    pAVar6 = _sound;
    if (pAVar5 != (AActor *)0x0) {
      pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
      bVar7 = P_CheckSight(pAVar6,pAVar5,0);
      if (bVar7) {
        A_FaceTarget(_sound);
        pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
        pAVar5 = TObjPtr<AActor>::operator->(&_sound->target);
        AActor::AngleTo((AActor *)local_88,pAVar5,SUB81(_sound,0));
        absangle<double>(&local_80,&(pAVar6->Angles).Yaw);
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
        bVar7 = P_CheckSight(pAVar6,_sound,0);
        local_169 = false;
        if (bVar7) {
          local_169 = TAngle<double>::operator<(&local_80,21.333333333333332);
        }
        pAVar6 = _sound;
        vec.Y._7_1_ = local_169;
        TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
        AActor::Vec2To((AActor *)&dx,pAVar6);
        local_188 = ABS(vec.X);
        if (local_188 < ABS(dx)) {
          local_188 = ABS(dx);
        }
        local_188 = (double)_blocksize * local_188;
        pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
        dVar8 = TVector3<double>::LengthSquared(&pAVar6->Vel);
        iVar3 = 0xa0;
        if (dVar8 < (double)pufftype) {
          iVar3 = 0x100;
        }
        iVar1 = 8;
        if ((vec.Y._7_1_ & 1) != 0) {
          iVar1 = 0x10;
        }
        angle_1.Degrees._4_4_ = iVar3 - (int)(local_188 / (double)longrange) * iVar1;
        pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)&angle_1,
                   (int)pAVar6 +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&angle_1);
        if (uVar2 != 0) {
          angle_1.Degrees._4_4_ = angle_1.Degrees._4_4_ >> 2;
        }
        iVar3 = FRandom::operator()(&pr_cabullet);
        if (iVar3 < angle_1.Degrees._4_4_) {
          pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
          AActor::AngleTo((AActor *)&BloodPos.Z,pAVar6,SUB81(_sound,0));
          pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
          pAVar5 = TObjPtr<AActor>::operator->(&_sound->target);
          dVar8 = pAVar5->radius;
          TAngle<double>::TAngle((TAngle<double> *)&mod,(TAngle<double> *)&BloodPos.Z);
          pAVar5 = TObjPtr<AActor>::operator->(&_sound->target);
          AActor::Vec3Angle((DVector3 *)local_f0,pAVar6,dVar8,(DAngle *)&mod,pAVar5->Height / 2.0,
                            false);
          if ((local_44 & 1) == 0) {
            iVar3 = FRandom::operator()(&pr_cabullet);
            local_19c = iVar3 % pointblank + 1;
          }
          else {
            local_19c = pointblank;
          }
          iStack_fc = local_19c;
          if ((double)runspeed._4_4_ <= local_188) {
            iStack_fc = local_19c >> 1;
          }
          if ((double)runspeed._0_4_ <= local_188) {
            iStack_fc = iStack_fc >> 1;
          }
          FName::FName(&local_100,NAME_None);
          pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_108,
                     (int)pAVar6 +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_108);
          local_19d = true;
          if (uVar2 == 0) {
            pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
            operator|((EnumType)&dpuff,MF2_INVULNERABLE);
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      ((TFlags<ActorFlag2,_unsigned_int> *)((long)&dpuff + 4),&pAVar6->flags2);
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&dpuff + 4));
            local_19d = uVar2 != 0;
          }
          local_101 = (local_19d ^ 0xffU) & 1;
          if (((local_44 & 2) == 0) || (angle.Degrees == 0.0)) {
            pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_134,
                       (int)pAVar6 +
                       (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_134);
            if (uVar2 != 0) {
              iStack_fc = iStack_fc >> 2;
            }
          }
          else {
            type = PClassActor::GetReplacement((PClassActor *)angle.Degrees,true);
            local_118 = GetDefaultByType(&type->super_PClass);
            FName::operator=(&local_100,&(local_118->DamageType).super_FName);
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_11c,(int)local_118 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_11c);
            bVar7 = false;
            if (uVar2 != 0) {
              pAVar6 = TObjPtr<AActor>::operator->(&_sound->target);
              TFlags<ActorFlag3,_unsigned_int>::operator&
                        (&local_120,
                         (int)pAVar6 +
                         (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
              uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_120);
              bVar7 = uVar2 != 0;
            }
            pAVar6 = _sound;
            pufftype_00.Degrees = angle.Degrees;
            if (bVar7) {
              iStack_fc = 0;
            }
            if (((local_101 ^ 0xff) & 1) != 0) {
              local_101 = 0;
              TAngle<double>::TAngle(&local_128,(TAngle<double> *)&BloodPos.Z);
              TAngle<double>::TAngle((TAngle<double> *)&newdam,(TAngle<double> *)&BloodPos.Z);
              P_SpawnPuff(pAVar6,(PClassActor *)pufftype_00.Degrees,(DVector3 *)local_f0,&local_128,
                          (DAngle *)&newdam,0,0,(AActor *)0x0);
            }
          }
          if (iStack_fc != 0) {
            pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
            pAVar6 = _sound;
            iVar3 = iStack_fc;
            FName::FName(&local_13c,&local_100);
            TAngle<double>::TAngle(&local_148,0.0);
            local_138 = P_DamageMobj(pAVar5,pAVar6,pAVar6,iVar3,&local_13c,4,&local_148);
            if ((local_101 & 1) != 0) {
              TAngle<double>::TAngle(&local_150,(TAngle<double> *)&BloodPos.Z);
              if (local_138 < 1) {
                local_1e4 = iStack_fc;
              }
              else {
                local_1e4 = local_138;
              }
              pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
              P_SpawnBlood((DVector3 *)local_f0,&local_150,local_1e4,pAVar6);
              if (local_138 < 1) {
                local_1ec = iStack_fc;
              }
              else {
                local_1ec = local_138;
              }
              pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_sound->target);
              P_TraceBleed(local_1ec,pAVar6,_sound);
            }
          }
        }
        pAVar6 = _sound;
        FSoundID::FSoundID(&local_154,&local_48);
        S_Sound(pAVar6,1,&local_154,1.0,1.0);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x14be,
                "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WolfAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)				
	PARAM_SOUND_DEF	(sound)				
	PARAM_FLOAT_DEF	(snipe)				
	PARAM_INT_DEF	(maxdamage)			
	PARAM_INT_DEF	(blocksize)			
	PARAM_INT_DEF	(pointblank)		
	PARAM_INT_DEF	(longrange)			
	PARAM_FLOAT_DEF	(runspeed)			
	PARAM_CLASS_DEF	(pufftype, AActor)	

	if (!self->target)
		return 0;

	// Enemy can't see target
	if (!P_CheckSight(self, self->target))
		return 0;

	A_FaceTarget (self);

	// Target can dodge if it can see enemy
	DAngle angle = absangle(self->target->Angles.Yaw, self->target->AngleTo(self));
	bool dodge = (P_CheckSight(self->target, self) && angle < 30. * 256. / 360.);	// 30 byteangles ~ 21�

	// Distance check is simplistic
	DVector2 vec = self->Vec2To(self->target);
	double dx = fabs (vec.X);
	double dy = fabs (vec.Y);
	double dist = dx > dy ? dx : dy;

	// Some enemies are more precise
	dist *= snipe;

	// Convert distance into integer number of blocks
	int idist = int(dist / blocksize);

	// Now for the speed accuracy thingie
	double speed = self->target->Vel.LengthSquared();
	int hitchance = speed < runspeed ? 256 : 160;

	// Distance accuracy (factoring dodge)
	hitchance -= idist * (dodge ? 16 : 8);

	// While we're here, we may as well do something for this:
	if (self->target->flags & MF_SHADOW)
	{
		hitchance >>= 2;
	}

	// The attack itself
	if (pr_cabullet() < hitchance)
	{
		// Compute position for spawning blood/puff
		DAngle angle = self->target->AngleTo(self);
		DVector3 BloodPos = self->target->Vec3Angle(self->target->radius, angle, self->target->Height/2);

		int damage = flags & WAF_NORANDOM ? maxdamage : (1 + (pr_cabullet() % maxdamage));
		if (dist >= pointblank)
			damage >>= 1;
		if (dist >= longrange)
			damage >>= 1;
		FName mod = NAME_None;
		bool spawnblood = !((self->target->flags & MF_NOBLOOD) 
			|| (self->target->flags2 & (MF2_INVULNERABLE|MF2_DORMANT)));
		if (flags & WAF_USEPUFF && pufftype)
		{
			AActor *dpuff = GetDefaultByType(pufftype->GetReplacement());
			mod = dpuff->DamageType;

			if (dpuff->flags2 & MF2_THRUGHOST && self->target->flags3 & MF3_GHOST)
				damage = 0;
			
			if ((0 && dpuff->flags3 & MF3_PUFFONACTORS) || !spawnblood)
			{
				spawnblood = false;
				P_SpawnPuff(self, pufftype, BloodPos, angle, angle, 0);
			}
		}
		else if (self->target->flags3 & MF3_GHOST)
			damage >>= 2;
		if (damage)
		{
			int newdam = P_DamageMobj(self->target, self, self, damage, mod, DMG_THRUSTLESS);
			if (spawnblood)
			{
				P_SpawnBlood(BloodPos, angle, newdam > 0 ? newdam : damage, self->target);
				P_TraceBleed(newdam > 0 ? newdam : damage, self->target, self);
			}
		}
	}

	// And finally, let's play the sound
	S_Sound (self, CHAN_WEAPON, sound, 1, ATTN_NORM);
	return 0;
}